

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O3

int ZXing::Pdf417::ProcessECI
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,int length,int code,
              Content *result)

{
  long lVar1;
  
  if (code - 0x39dU < 3 && codeIndex < length) {
    if (code == 0x39f) {
      lVar1 = (long)codeIndex;
      codeIndex = codeIndex + 1;
      Content::switchEncoding
                (result,*(ECI *)((long)&(codewords->super__Vector_base<int,_std::allocator<int>_>).
                                        _M_impl.super__Vector_impl_data._M_start + lVar1 * 4),true);
    }
    else {
      codeIndex = codeIndex + (uint)(code == 0x39e) + 1;
    }
  }
  return codeIndex;
}

Assistant:

static int ProcessECI(const std::vector<int>& codewords, int codeIndex, const int length, const int code, Content& result)
{
	if (codeIndex < length && IsECI(code)) {
		if (code == ECI_CHARSET)
			result.switchEncoding(ECI(codewords[codeIndex++]));
		else
			codeIndex += code == ECI_GENERAL_PURPOSE ? 2 : 1; // Don't currently handle non-character set ECIs so just ignore
	}

	return codeIndex;
}